

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O2

void pwm_chn_w(void *info,UINT8 Channel,UINT16 data)

{
  byte bVar1;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,Channel) & 0xffffffff) {
  case 0:
    bVar1 = 0x10;
    if ((data & 0xf00) != 0) {
      bVar1 = (byte)(data >> 8) & 0xf;
    }
    *(byte *)((long)info + 0xb) = bVar1;
    *(byte *)((long)info + 10) = bVar1;
    return;
  case 1:
    PWM_Set_Cycle((pwm_chip *)info,data);
    return;
  case 2:
    *(UINT16 *)((long)info + 0x10) = data;
    return;
  case 3:
    *(UINT16 *)((long)info + 0xe) = data;
    if ((*(char *)((long)info + 0xc) == '\0') && (*(UINT16 *)((long)info + 0x10) == data)) {
LAB_00153188:
      *(uint *)((long)info + 0x14) = (uint)data;
      *(undefined1 *)((long)info + 0xc) = 1;
      return;
    }
    break;
  case 4:
    *(UINT16 *)((long)info + 0x10) = data;
    *(UINT16 *)((long)info + 0xe) = data;
    if (*(char *)((long)info + 0xc) == '\0') goto LAB_00153188;
  }
  return;
}

Assistant:

static void pwm_chn_w(void* info, UINT8 Channel, UINT16 data)
{
	pwm_chip* chip = (pwm_chip*)info;
	
	switch(Channel)
	{
	case 0x00/2:	// control register
		PWM_Set_Int(chip, data >> 8);
		break;
	case 0x02/2:	// cycle register
		PWM_Set_Cycle(chip, data);
		break;
	case 0x04/2:	// l ch
		chip->PWM_Out_L = data;
		break;
	case 0x06/2:	// r ch
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			if (chip->PWM_Out_L == chip->PWM_Out_R)
			{
				// fixes these terrible pops when
				// starting/stopping/pausing the song
				chip->PWM_Offset = data;
				chip->PWM_Mode = 0x01;
			}
		}
		break;
	case 0x08/2:	// mono ch
		chip->PWM_Out_L = data;
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			chip->PWM_Offset = data;
			chip->PWM_Mode = 0x01;
		}
		break;
	}
	
	return;
}